

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_DDictHashSet_expand(ZSTD_DDictHashSet *hashSet,ZSTD_customMem customMem)

{
  long lVar1;
  long lVar2;
  ZSTD_customMem customMem_00;
  ZSTD_customMem customMem_01;
  uint uVar3;
  void *pvVar4;
  long *in_RDI;
  size_t in_stack_00000018;
  size_t err_code;
  size_t i;
  size_t oldTableSize;
  ZSTD_DDict **oldTable;
  ZSTD_DDict **newTable;
  size_t newTableSize;
  ZSTD_DDict *in_stack_ffffffffffffffb0;
  ZSTD_DDictHashSet *hashSet_00;
  void *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  ulong uVar5;
  void *in_stack_ffffffffffffffd0;
  ulong uVar6;
  size_t local_8;
  
  hashSet_00 = (ZSTD_DDictHashSet *)&stack0x00000008;
  lVar1 = in_RDI[1];
  customMem_01.customFree = (ZSTD_freeFunction)in_stack_ffffffffffffffc8;
  customMem_01.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffc0;
  customMem_01.opaque = in_stack_ffffffffffffffd0;
  pvVar4 = ZSTD_customCalloc(in_stack_00000018,customMem_01);
  lVar2 = *in_RDI;
  uVar6 = in_RDI[1];
  if (pvVar4 == (void *)0x0) {
    local_8 = 0xffffffffffffffc0;
  }
  else {
    *in_RDI = (long)pvVar4;
    in_RDI[1] = lVar1 << 1;
    in_RDI[2] = 0;
    for (uVar5 = 0; uVar5 < uVar6; uVar5 = uVar5 + 1) {
      if (*(long *)(lVar2 + uVar5 * 8) != 0) {
        in_stack_ffffffffffffffc0 =
             (void *)ZSTD_DDictHashSet_emplaceDDict(hashSet_00,in_stack_ffffffffffffffb0);
        uVar3 = ERR_isError((size_t)in_stack_ffffffffffffffc0);
        if (uVar3 != 0) {
          return (size_t)in_stack_ffffffffffffffc0;
        }
      }
    }
    customMem_00.customFree = (ZSTD_freeFunction)hashSet_00;
    customMem_00.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffb0;
    customMem_00.opaque = in_stack_ffffffffffffffc0;
    ZSTD_customFree((void *)hashSet_00->ddictPtrTableSize,customMem_00);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t ZSTD_DDictHashSet_expand(ZSTD_DDictHashSet* hashSet, ZSTD_customMem customMem) {
    size_t newTableSize = hashSet->ddictPtrTableSize * DDICT_HASHSET_RESIZE_FACTOR;
    const ZSTD_DDict** newTable = (const ZSTD_DDict**)ZSTD_customCalloc(sizeof(ZSTD_DDict*) * newTableSize, customMem);
    const ZSTD_DDict** oldTable = hashSet->ddictPtrTable;
    size_t oldTableSize = hashSet->ddictPtrTableSize;
    size_t i;

    DEBUGLOG(4, "Expanding DDict hash table! Old size: %zu new size: %zu", oldTableSize, newTableSize);
    RETURN_ERROR_IF(!newTable, memory_allocation, "Expanded hashset allocation failed!");
    hashSet->ddictPtrTable = newTable;
    hashSet->ddictPtrTableSize = newTableSize;
    hashSet->ddictPtrCount = 0;
    for (i = 0; i < oldTableSize; ++i) {
        if (oldTable[i] != NULL) {
            FORWARD_IF_ERROR(ZSTD_DDictHashSet_emplaceDDict(hashSet, oldTable[i]), "");
        }
    }
    ZSTD_customFree((void*)oldTable, customMem);
    DEBUGLOG(4, "Finished re-hash");
    return 0;
}